

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

void __thiscall CVmObjFileName::load_image_data(CVmObjFileName *this,char *ptr,size_t siz)

{
  ushort uVar1;
  int32_t sfid;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  char *__s;
  long *plVar7;
  char sfbuf [4096];
  uint local_1028 [2];
  undefined8 local_1020;
  void *local_1018;
  __jmp_buf_tag local_1010 [20];
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  sfid = *(int32_t *)ptr;
  if (sfid == 0) {
    uVar1 = *(ushort *)(ptr + 4);
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    local_1020 = *puVar5;
    uVar6 = _ZTW11G_err_frame();
    *(uint **)uVar6 = local_1028;
    local_1028[0] = _setjmp(local_1010);
    if (local_1028[0] == 0) {
      __s = url_to_local(ptr + 6,(ulong)uVar1,0);
      sVar4 = strlen(__s);
      ptr = (char *)vm_filnam_ext::alloc_ext(this,0,__s,sVar4);
    }
    else {
      __s = (char *)0x0;
    }
    if (-1 < (short)local_1028[0]) {
      local_1028[0] = local_1028[0] | 0x8000;
      lib_free_str(__s);
    }
    uVar6 = local_1020;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = uVar6;
    if ((local_1028[0] & 0x4001) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar5 & 2) != 0) {
        plVar7 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar7 + 0x10));
      }
      pvVar2 = local_1018;
      plVar7 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar7 + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_1028[0] & 2) != 0) {
      free(local_1018);
    }
  }
  else {
    iVar3 = CVmObjFile::sfid_to_path((char *)local_1028,0x1000,sfid);
    sVar4 = strlen((char *)local_1028);
    ptr = (char *)vm_filnam_ext::alloc_ext(this,sfid,(char *)local_1028,sVar4);
    ((vm_filnam_ext *)ptr)->sfid_valid = (char)iVar3;
  }
  (this->super_CVmObject).ext_ = ptr;
  return;
}

Assistant:

void CVmObjFileName::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* get the special file ID */
    int32_t sfid = osrp4s(ptr);

    /* if there's a special file ID, look it up; otherwise load the name */
    vm_filnam_ext *ext;
    if (sfid != 0)
    {
        /* translate the special file ID to a path */
        char sfbuf[OSFNMAX];
        int ok = CVmObjFile::sfid_to_path(vmg_ sfbuf, sizeof(sfbuf), sfid);

        /* allocate the extension */
        ext = vm_filnam_ext::alloc_ext(vmg_ this, sfid, sfbuf, strlen(sfbuf));

        /* note whether the special file ID is valid */
        ext->sfid_valid = (char)ok;
    }
    else
    {
        /* get the filename pointer and length */
        const char *str = ptr + 4;
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        char *lcl = 0;
        err_try
        {
            /* convert the universal path string to local notation */
            lcl = url_to_local(vmg_ str, len, FALSE);

            /* allocate the extension */
            ext = vm_filnam_ext::alloc_ext(vmg_ this, 0, lcl, strlen(lcl));
        }
        err_finally
        {
            lib_free_str(lcl);
        }